

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_third_step2.cpp
# Opt level: O3

void __thiscall
ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
          (PositionThirdOrderStep2 *this,double tf,double p0,double v0,double a0,double pf,double vf
          ,double af,double vMax,double vMin,double aMax,double aMin,double jMax)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  this->v0 = v0;
  this->a0 = a0;
  this->tf = tf;
  this->vf = vf;
  this->af = af;
  this->_vMax = vMax;
  this->_vMin = vMin;
  this->_aMax = aMax;
  this->_aMin = aMin;
  this->_jMax = jMax;
  this->minimize_jerk = false;
  dVar2 = pf - p0;
  this->pd = dVar2;
  dVar1 = tf * tf;
  this->tf_tf = dVar1;
  this->tf_p3 = dVar1 * tf;
  this->tf_p4 = dVar1 * dVar1;
  dVar1 = vf - v0;
  this->vd = dVar1;
  this->vd_vd = dVar1 * dVar1;
  dVar1 = a0 * a0;
  dVar3 = af - a0;
  this->ad = dVar3;
  this->ad_ad = dVar3 * dVar3;
  this->v0_v0 = v0 * v0;
  this->vf_vf = vf * vf;
  this->a0_a0 = dVar1;
  this->a0_p3 = a0 * dVar1;
  this->a0_p4 = dVar1 * dVar1;
  this->a0_p5 = a0 * dVar1 * dVar1;
  this->a0_p6 = dVar1 * dVar1 * dVar1;
  dVar1 = af * af;
  this->af_af = dVar1;
  this->af_p3 = af * dVar1;
  this->af_p4 = dVar1 * dVar1;
  this->af_p5 = af * dVar1 * dVar1;
  this->af_p6 = dVar1 * dVar1 * dVar1;
  this->jMax_jMax = jMax * jMax;
  this->g1 = v0 * tf + -dVar2;
  this->g2 = dVar2 * -2.0 + (vf + v0) * tf;
  return;
}

Assistant:

PositionThirdOrderStep2::PositionThirdOrderStep2(double tf, double p0, double v0, double a0, double pf, double vf, double af, double vMax, double vMin, double aMax, double aMin, double jMax): v0(v0), a0(a0), tf(tf), vf(vf), af(af), _vMax(vMax), _vMin(vMin), _aMax(aMax), _aMin(aMin), _jMax(jMax) {
    pd = pf - p0;
    tf_tf = tf * tf;
    tf_p3 = tf_tf * tf;
    tf_p4 = tf_tf * tf_tf;

    vd = vf - v0;
    vd_vd = vd * vd;
    v0_v0 = v0 * v0;
    vf_vf = vf * vf;

    ad = af - a0;
    ad_ad = ad * ad;
    a0_a0 = a0 * a0;
    af_af = af * af;

    a0_p3 = a0 * a0_a0;
    a0_p4 = a0_a0 * a0_a0;
    a0_p5 = a0_p3 * a0_a0;
    a0_p6 = a0_p4 * a0_a0;
    af_p3 = af * af_af;
    af_p4 = af_af * af_af;
    af_p5 = af_p3 * af_af;
    af_p6 = af_p4 * af_af;

    // max values needs to be invariant to plus minus sign change
    jMax_jMax = jMax * jMax;

    g1 = -pd + tf*v0;
    g2 = -2*pd + tf*(v0 + vf);
}